

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshMapper.h
# Opt level: O1

void __thiscall
anurbs::MeshMapper<3L>::MeshMapper
          (MeshMapper<3L> *this,
          Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *vertices,
          Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *faces)

{
  RTree<3L> *this_00;
  double dVar1;
  double dVar2;
  PointerType plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  PointerType pdVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ActualDstType actualDst;
  long lVar12;
  long lVar13;
  ActualDstType actualDst_1;
  assign_op<long,_long> local_71;
  Vertices *local_70;
  MeshMapper<3L> *local_68;
  Vector local_60;
  Vector local_48;
  
  (this->m_faces).super_PlainObjectBase<Eigen::Matrix<long,__1,_3,_1,__1,_3>_>.m_storage.m_data =
       (long *)0x0;
  (this->m_faces).super_PlainObjectBase<Eigen::Matrix<long,__1,_3,_1,__1,_3>_>.m_storage.m_rows = 0;
  local_68 = this;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<long,_1,3,1,_1,3>,Eigen::Ref<Eigen::Matrix<long,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>,Eigen::internal::assign_op<long,long>>
            (&this->m_faces,faces,&local_71);
  local_70 = &this->m_vertices;
  (this->m_vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_1,__1,_3>_>.m_storage.m_data
       = (double *)0x0;
  (this->m_vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_1,__1,_3>_>.m_storage.m_rows
       = 0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,3,1,_1,3>,Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>,Eigen::internal::assign_op<double,double>>
            (local_70,vertices,(assign_op<double,_double> *)&local_71);
  this_00 = &this->m_rtree;
  RTree<3L>::RTree(this_00,(faces->
                           super_RefBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
                           ).
                           super_MapBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value,0x10);
  if (0 < (faces->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value) {
    lVar12 = 0;
    do {
      plVar3 = (faces->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      lVar13 = (faces->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value * lVar12;
      lVar4 = plVar3[lVar13];
      if ((((lVar4 < 0) ||
           (lVar5 = (vertices->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_rows.m_value, lVar5 <= lVar4)) || (lVar6 = plVar3[lVar13 + 1], lVar6 < 0)) ||
         (((lVar5 <= lVar6 || (lVar13 = plVar3[lVar13 + 2], lVar13 < 0)) || (lVar5 <= lVar13)))) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<Eigen::Ref<const Eigen::Matrix<double, -1, 3>>, 1, 3, true>::Block(XprType &, Index) [XprType = Eigen::Ref<const Eigen::Matrix<double, -1, 3>>, BlockRows = 1, BlockCols = 3, InnerPanel = true]"
                     );
      }
      pdVar7 = (vertices->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      lVar5 = (vertices->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      dVar8 = pdVar7[lVar4 * lVar5];
      dVar9 = (pdVar7 + lVar4 * lVar5)[1];
      dVar1 = pdVar7[lVar4 * lVar5 + 2];
      dVar2 = pdVar7[lVar6 * lVar5 + 2];
      dVar10 = pdVar7[lVar6 * lVar5];
      dVar11 = (pdVar7 + lVar6 * lVar5)[1];
      local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = pdVar7[lVar13 * lVar5];
      local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = (pdVar7 + lVar13 * lVar5)[1];
      local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = pdVar7[lVar13 * lVar5 + 2];
      local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [0] = local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[0];
      if (dVar10 <= local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                    m_data.array[0]) {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [0] = dVar10;
      }
      if (dVar8 <= local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                   m_data.array[0]) {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [0] = dVar8;
      }
      if (local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[0] <= dVar10) {
        local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [0] = dVar10;
      }
      if (local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[0] <= dVar8) {
        local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [0] = dVar8;
      }
      local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [1] = local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[1];
      if (dVar11 <= local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                    m_data.array[1]) {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [1] = dVar11;
      }
      if (dVar9 <= local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                   m_data.array[1]) {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [1] = dVar9;
      }
      local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
      [2] = local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[2];
      if (dVar2 <= local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                   m_data.array[2]) {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [2] = dVar2;
      }
      if (dVar1 <= local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                   m_data.array[2]) {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [2] = dVar1;
      }
      if (local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[1] <= dVar11) {
        local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [1] = dVar11;
      }
      if (local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[1] <= dVar9) {
        local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [1] = dVar9;
      }
      if (local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[2] <= dVar2) {
        local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [2] = dVar2;
      }
      if (local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[2] <= dVar1) {
        local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [2] = dVar1;
      }
      RTree<3L>::add(this_00,&local_48,&local_60);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (faces->
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<long,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_rows.m_value);
  }
  RTree<3L>::finish(this_00,true);
  return;
}

Assistant:

MeshMapper(Eigen::Ref<const Vertices>& vertices, Eigen::Ref<const Faces>& faces)
        : m_vertices(vertices)
        , m_faces(faces)
        , m_rtree(faces.rows())
    {
        for (Index i = 0; i < faces.rows(); i++) {
            Eigen::Array<double, 3, TDimension> triangle;

            triangle.row(0) = vertices.row(faces(i, 0));
            triangle.row(1) = vertices.row(faces(i, 1));
            triangle.row(2) = vertices.row(faces(i, 2));

            Vector box_a = triangle.colwise().minCoeff();
            Vector box_b = triangle.colwise().maxCoeff();

            m_rtree.add(box_a, box_b);
        }

        m_rtree.finish(true);
    }